

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall
ClipperLib::Clipper::JoinPoints(Clipper *this,Join *j,OutRec *outRec1,OutRec *outRec2)

{
  IntPoint *pIVar1;
  code UseFullInt64Range;
  OutPt *pOVar2;
  long lVar3;
  long lVar4;
  OutPt *pOVar5;
  OutPt *pOVar6;
  OutPt *pOVar7;
  cInt cVar8;
  bool bVar9;
  IntPoint IVar10;
  bool bVar11;
  bool bVar12;
  OutPt *pOVar13;
  OutPt *pOVar14;
  OutPt *pOVar15;
  cInt *pcVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  OutPt *pOVar20;
  OutPt *pOVar21;
  OutPt *result;
  OutPt *pOVar22;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt3_01;
  IntPoint pt3_02;
  undefined1 in_stack_ffffffffffffff7c [12];
  cInt local_78;
  
  pOVar22 = j->OutPt1;
  pOVar2 = j->OutPt2;
  pIVar1 = &pOVar22->Pt;
  lVar18 = pIVar1->X;
  lVar3 = (pOVar22->Pt).Y;
  IVar10 = *pIVar1;
  lVar4 = (j->OffPt).Y;
  pOVar13 = pOVar22;
  if (lVar3 != lVar4) {
    do {
      pOVar13 = pOVar13->Next;
      lVar19 = (pOVar13->Pt).Y;
      if ((pOVar13 == pOVar22) || ((pOVar13->Pt).X != lVar18)) break;
    } while (lVar19 == lVar3);
    pOVar14 = pOVar22;
    if (lVar19 <= lVar3) {
      local_78 = (j->OffPt).X;
      UseFullInt64Range =
           (this->_vptr_Clipper[-3] + 8)
           [(long)&(this->m_GhostJoins).
                   super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>];
      pt3.Y = lVar4;
      pt3.X = local_78;
      bVar12 = SlopesEqual(*pIVar1,pOVar13->Pt,pt3,(bool)UseFullInt64Range);
      if (bVar12) {
        bVar12 = false;
        goto LAB_00294837;
      }
    }
    do {
      pOVar13 = pOVar14->Prev;
      lVar19 = (pOVar13->Pt).Y;
      if ((pOVar13 == pOVar22) || ((pOVar13->Pt).X != lVar18)) break;
      pOVar14 = pOVar13;
    } while (lVar19 == lVar3);
    if (lVar3 < lVar19) {
      return false;
    }
    local_78 = (j->OffPt).X;
    UseFullInt64Range =
         (this->_vptr_Clipper[-3] + 8)
         [(long)&(this->m_GhostJoins).
                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>];
    pt3_00.Y = lVar4;
    pt3_00.X = local_78;
    bVar12 = SlopesEqual(IVar10,pOVar13->Pt,pt3_00,(bool)UseFullInt64Range);
    if (!bVar12) {
      return false;
    }
    bVar12 = true;
LAB_00294837:
    pIVar1 = &pOVar2->Pt;
    lVar18 = pIVar1->X;
    lVar3 = (pOVar2->Pt).Y;
    IVar10 = *pIVar1;
    pOVar14 = pOVar2;
    do {
      pOVar14 = pOVar14->Next;
      lVar19 = (pOVar14->Pt).Y;
      if (((pOVar14->Pt).X != lVar18) || (lVar19 != lVar3)) break;
    } while (pOVar14 != pOVar2);
    pOVar15 = pOVar2;
    if ((lVar3 < lVar19) ||
       (pt3_01.Y = lVar4, pt3_01.X = local_78,
       bVar11 = SlopesEqual(*pIVar1,pOVar14->Pt,pt3_01,(bool)UseFullInt64Range), !bVar11)) {
      while( true ) {
        pOVar14 = pOVar15->Prev;
        lVar19 = (pOVar14->Pt).Y;
        if ((pOVar14->Pt).X != lVar18) break;
        if ((lVar19 != lVar3) || (pOVar15 = pOVar14, pOVar14 == pOVar2)) break;
      }
      if (lVar3 < lVar19) {
        return false;
      }
      pt3_02.Y = lVar4;
      pt3_02.X = local_78;
      bVar11 = SlopesEqual(IVar10,pOVar14->Pt,pt3_02,(bool)UseFullInt64Range);
      bVar17 = 1;
      if (!bVar11) {
        return false;
      }
    }
    else {
      bVar17 = 0;
    }
    if (pOVar13 == pOVar14) {
      return false;
    }
    if (pOVar13 == pOVar22) {
      return false;
    }
    if (pOVar14 == pOVar2) {
      return false;
    }
    if ((bool)(outRec1 == outRec2 & (bVar17 ^ bVar12 ^ 1))) {
      return false;
    }
    pOVar13 = (OutPt *)operator_new(0x28);
    cVar8 = (pOVar22->Pt).Y;
    (pOVar13->Pt).X = (pOVar22->Pt).X;
    (pOVar13->Pt).Y = cVar8;
    pOVar13->Idx = pOVar22->Idx;
    if (bVar12) {
      pOVar14 = pOVar22->Prev;
      pOVar13->Prev = pOVar14;
      pOVar13->Next = pOVar22;
      pOVar14->Next = pOVar13;
      pOVar22->Prev = pOVar13;
      pOVar15 = (OutPt *)operator_new(0x28);
      cVar8 = (pOVar2->Pt).Y;
      (pOVar15->Pt).X = (pOVar2->Pt).X;
      (pOVar15->Pt).Y = cVar8;
      pOVar15->Idx = pOVar2->Idx;
      pOVar14 = pOVar2->Next;
      pOVar15->Next = pOVar14;
      pOVar14->Prev = pOVar15;
      pOVar22->Prev = pOVar2;
      pOVar2->Next = pOVar22;
      pOVar13->Next = pOVar15;
      pOVar15->Prev = pOVar13;
    }
    else {
      pOVar14 = pOVar22->Next;
      pOVar13->Next = pOVar14;
      pOVar13->Prev = pOVar22;
      pOVar14->Prev = pOVar13;
      pOVar22->Next = pOVar13;
      pOVar15 = (OutPt *)operator_new(0x28);
      cVar8 = (pOVar2->Pt).Y;
      (pOVar15->Pt).X = (pOVar2->Pt).X;
      (pOVar15->Pt).Y = cVar8;
      pOVar15->Idx = pOVar2->Idx;
      pOVar14 = pOVar2->Prev;
      pOVar15->Prev = pOVar14;
      pOVar14->Next = pOVar15;
      pOVar22->Next = pOVar2;
      pOVar2->Prev = pOVar22;
      pOVar13->Prev = pOVar15;
      pOVar15->Next = pOVar13;
    }
    j->OutPt1 = pOVar22;
    j->OutPt2 = pOVar13;
    return true;
  }
  lVar4 = (j->OffPt).X;
  if (((lVar4 == lVar18) && (lVar4 == (pOVar2->Pt).X)) && (lVar3 == (pOVar2->Pt).Y)) {
    if (outRec1 != outRec2) {
      return false;
    }
    while (pOVar13 = pOVar13->Next, pOVar14 = pOVar2, pOVar13 != pOVar22) {
      lVar18 = (pOVar13->Pt).Y;
      if (((pOVar13->Pt).X != lVar4) || (lVar18 != lVar3)) goto LAB_002949d5;
    }
    lVar18 = (pOVar13->Pt).Y;
LAB_002949d5:
    do {
      pOVar14 = pOVar14->Next;
      if (pOVar14 == pOVar2) {
        lVar19 = (pOVar14->Pt).Y;
LAB_002949f3:
        bVar12 = lVar19 <= lVar3 == lVar3 < lVar18;
        if (bVar12) {
          bVar11 = lVar18 <= lVar3;
          bVar9 = lVar3 < lVar18;
          pOVar14 = (OutPt *)operator_new(0x28);
          cVar8 = (pOVar22->Pt).Y;
          (pOVar14->Pt).X = (pOVar22->Pt).X;
          (pOVar14->Pt).Y = cVar8;
          pOVar14->Idx = pOVar22->Idx;
          pOVar13 = (&pOVar22->Next)[bVar9];
          (&pOVar14->Next)[bVar9] = pOVar13;
          (&pOVar14->Next)[bVar11] = pOVar22;
          (&pOVar13->Next)[bVar11] = pOVar14;
          (&pOVar22->Next)[bVar9] = pOVar14;
          pOVar15 = (OutPt *)operator_new(0x28);
          cVar8 = (pOVar2->Pt).Y;
          (pOVar15->Pt).X = (pOVar2->Pt).X;
          (pOVar15->Pt).Y = cVar8;
          pOVar15->Idx = pOVar2->Idx;
          pOVar13 = (&pOVar2->Next)[bVar11];
          (&pOVar15->Next)[bVar11] = pOVar13;
          (&pOVar13->Next)[bVar9] = pOVar15;
          (&pOVar22->Next)[bVar9] = pOVar2;
          (&pOVar2->Next)[bVar11] = pOVar22;
          (&pOVar14->Next)[bVar11] = pOVar15;
          (&pOVar15->Next)[bVar9] = pOVar14;
          j->OutPt1 = pOVar22;
          j->OutPt2 = pOVar14;
          return bVar12;
        }
        return bVar12;
      }
      lVar19 = (pOVar14->Pt).Y;
      if (((pOVar14->Pt).X != lVar4) || (lVar19 != lVar3)) goto LAB_002949f3;
    } while( true );
  }
  do {
    pOVar14 = pOVar13;
    pOVar13 = pOVar14->Prev;
    if ((pOVar13 == pOVar22) || ((pOVar13->Pt).Y != lVar3)) break;
  } while (pOVar13 != pOVar2);
  do {
    pOVar13 = pOVar22;
    pOVar22 = pOVar13->Next;
    if ((pOVar22 == pOVar14) || ((pOVar22->Pt).Y != lVar3)) break;
  } while (pOVar22 != pOVar2);
  if (pOVar22 == pOVar14 || pOVar22 == pOVar2) {
    return false;
  }
  pcVar16 = &(pOVar13->Pt).Y;
  lVar18 = (pOVar2->Pt).Y;
  pOVar22 = pOVar2;
  do {
    pOVar15 = pOVar22;
    pOVar22 = pOVar15->Prev;
    if ((pOVar22 == pOVar13) || ((pOVar22->Pt).Y != lVar18)) break;
  } while (pOVar22 != pOVar2);
  do {
    pOVar22 = pOVar2;
    pOVar2 = pOVar22->Next;
    if ((pOVar2 == pOVar14) || (pOVar2 == pOVar15)) break;
  } while ((pOVar2->Pt).Y == lVar18);
  if (pOVar2 == pOVar15 || pOVar2 == pOVar14) {
    return false;
  }
  pOVar2 = (OutPt *)(pOVar14->Pt).X;
  pOVar5 = (OutPt *)(pOVar13->Pt).X;
  pOVar6 = (OutPt *)(pOVar15->Pt).X;
  pOVar7 = (OutPt *)(pOVar22->Pt).X;
  pOVar20 = pOVar6;
  if ((long)pOVar2 < (long)pOVar5) {
    pOVar21 = pOVar5;
    if ((long)pOVar6 < (long)pOVar7) {
      if ((long)pOVar6 < (long)pOVar2) {
        pOVar20 = pOVar2;
      }
LAB_002949c5:
      if ((long)pOVar7 < (long)pOVar21) {
        pOVar21 = pOVar7;
      }
      goto LAB_00294ad7;
    }
    pOVar20 = pOVar7;
    if ((long)pOVar7 < (long)pOVar2) {
      pOVar20 = pOVar2;
    }
  }
  else {
    pOVar21 = pOVar2;
    if ((long)pOVar6 < (long)pOVar7) {
      if ((long)pOVar6 < (long)pOVar5) {
        pOVar20 = pOVar5;
      }
      goto LAB_002949c5;
    }
    pOVar20 = pOVar7;
    if ((long)pOVar7 < (long)pOVar5) {
      pOVar20 = pOVar5;
    }
  }
  if ((long)pOVar6 < (long)pOVar21) {
    pOVar21 = pOVar6;
  }
LAB_00294ad7:
  if ((long)pOVar21 <= (long)pOVar20) {
    return false;
  }
  if (((long)pOVar2 < (long)pOVar20) || ((long)pOVar21 < (long)pOVar2)) {
    if (((long)pOVar6 < (long)pOVar20) || ((long)pOVar21 < (long)pOVar6)) {
      if (((long)pOVar5 < (long)pOVar20) ||
         (pOVar20 = pOVar5, bVar12 = (long)pOVar2 < (long)pOVar5, (long)pOVar21 < (long)pOVar5)) {
        pcVar16 = &(pOVar22->Pt).Y;
        pOVar20 = pOVar7;
        bVar12 = (long)pOVar6 < (long)pOVar7;
      }
    }
    else {
      pcVar16 = &(pOVar15->Pt).Y;
      pOVar20 = pOVar6;
      bVar12 = (long)pOVar7 < (long)pOVar6;
    }
  }
  else {
    pcVar16 = &(pOVar14->Pt).Y;
    pOVar20 = pOVar2;
    bVar12 = (long)pOVar5 < (long)pOVar2;
  }
  cVar8 = *pcVar16;
  j->OutPt1 = pOVar14;
  j->OutPt2 = pOVar15;
  IVar10._4_12_ = in_stack_ffffffffffffff7c;
  IVar10.X._0_4_ = (uint)bVar12;
  bVar12 = JoinHorz((ClipperLib *)pOVar14,pOVar13,pOVar15,pOVar22,pOVar20,IVar10,SUB81(cVar8,0));
  return bVar12;
}

Assistant:

bool Clipper::JoinPoints(Join *j, OutRec* outRec1, OutRec* outRec2)
{
  OutPt *op1 = j->OutPt1, *op1b;
  OutPt *op2 = j->OutPt2, *op2b;

  //There are 3 kinds of joins for output polygons ...
  //1. Horizontal joins where Join.OutPt1 & Join.OutPt2 are vertices anywhere
  //along (horizontal) collinear edges (& Join.OffPt is on the same horizontal).
  //2. Non-horizontal joins where Join.OutPt1 & Join.OutPt2 are at the same
  //location at the Bottom of the overlapping segment (& Join.OffPt is above).
  //3. StrictSimple joins where edges touch but are not collinear and where
  //Join.OutPt1, Join.OutPt2 & Join.OffPt all share the same point.
  bool isHorizontal = (j->OutPt1->Pt.Y == j->OffPt.Y);

  if (isHorizontal  && (j->OffPt == j->OutPt1->Pt) &&
  (j->OffPt == j->OutPt2->Pt))
  {
    //Strictly Simple join ...
    if (outRec1 != outRec2) return false;
    op1b = j->OutPt1->Next;
    while (op1b != op1 && (op1b->Pt == j->OffPt)) 
      op1b = op1b->Next;
    bool reverse1 = (op1b->Pt.Y > j->OffPt.Y);
    op2b = j->OutPt2->Next;
    while (op2b != op2 && (op2b->Pt == j->OffPt)) 
      op2b = op2b->Next;
    bool reverse2 = (op2b->Pt.Y > j->OffPt.Y);
    if (reverse1 == reverse2) return false;
    if (reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  } 
  else if (isHorizontal)
  {
    //treat horizontal joins differently to non-horizontal joins since with
    //them we're not yet sure where the overlapping is. OutPt1.Pt & OutPt2.Pt
    //may be anywhere along the horizontal edge.
    op1b = op1;
    while (op1->Prev->Pt.Y == op1->Pt.Y && op1->Prev != op1b && op1->Prev != op2)
      op1 = op1->Prev;
    while (op1b->Next->Pt.Y == op1b->Pt.Y && op1b->Next != op1 && op1b->Next != op2)
      op1b = op1b->Next;
    if (op1b->Next == op1 || op1b->Next == op2) return false; //a flat 'polygon'

    op2b = op2;
    while (op2->Prev->Pt.Y == op2->Pt.Y && op2->Prev != op2b && op2->Prev != op1b)
      op2 = op2->Prev;
    while (op2b->Next->Pt.Y == op2b->Pt.Y && op2b->Next != op2 && op2b->Next != op1)
      op2b = op2b->Next;
    if (op2b->Next == op2 || op2b->Next == op1) return false; //a flat 'polygon'

    cInt Left, Right;
    //Op1 --> Op1b & Op2 --> Op2b are the extremites of the horizontal edges
    if (!GetOverlap(op1->Pt.X, op1b->Pt.X, op2->Pt.X, op2b->Pt.X, Left, Right))
      return false;

    //DiscardLeftSide: when overlapping edges are joined, a spike will created
    //which needs to be cleaned up. However, we don't want Op1 or Op2 caught up
    //on the discard Side as either may still be needed for other joins ...
    IntPoint Pt;
    bool DiscardLeftSide;
    if (op1->Pt.X >= Left && op1->Pt.X <= Right) 
    {
      Pt = op1->Pt; DiscardLeftSide = (op1->Pt.X > op1b->Pt.X);
    } 
    else if (op2->Pt.X >= Left&& op2->Pt.X <= Right) 
    {
      Pt = op2->Pt; DiscardLeftSide = (op2->Pt.X > op2b->Pt.X);
    } 
    else if (op1b->Pt.X >= Left && op1b->Pt.X <= Right)
    {
      Pt = op1b->Pt; DiscardLeftSide = op1b->Pt.X > op1->Pt.X;
    } 
    else
    {
      Pt = op2b->Pt; DiscardLeftSide = (op2b->Pt.X > op2->Pt.X);
    }
    j->OutPt1 = op1; j->OutPt2 = op2;
    return JoinHorz(op1, op1b, op2, op2b, Pt, DiscardLeftSide);
  } else
  {
    //nb: For non-horizontal joins ...
    //    1. Jr.OutPt1.Pt.Y == Jr.OutPt2.Pt.Y
    //    2. Jr.OutPt1.Pt > Jr.OffPt.Y

    //make sure the polygons are correctly oriented ...
    op1b = op1->Next;
    while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Next;
    bool Reverse1 = ((op1b->Pt.Y > op1->Pt.Y) ||
      !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse1)
    {
      op1b = op1->Prev;
      while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Prev;
      if ((op1b->Pt.Y > op1->Pt.Y) ||
        !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange)) return false;
    };
    op2b = op2->Next;
    while ((op2b->Pt == op2->Pt) && (op2b != op2))op2b = op2b->Next;
    bool Reverse2 = ((op2b->Pt.Y > op2->Pt.Y) ||
      !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse2)
    {
      op2b = op2->Prev;
      while ((op2b->Pt == op2->Pt) && (op2b != op2)) op2b = op2b->Prev;
      if ((op2b->Pt.Y > op2->Pt.Y) ||
        !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange)) return false;
    }

    if ((op1b == op1) || (op2b == op2) || (op1b == op2b) ||
      ((outRec1 == outRec2) && (Reverse1 == Reverse2))) return false;

    if (Reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  }
}